

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

bool __thiscall vera::Model::setGeom(Model *this,Mesh *_mesh)

{
  ulong uVar1;
  bool bVar2;
  DrawMode DVar3;
  Vbo *pVVar4;
  size_t sVar5;
  vec3 *_v;
  float fVar6;
  float y;
  allocator local_499;
  string local_498;
  allocator local_471;
  string local_470;
  allocator local_449;
  string local_448;
  allocator local_421;
  string local_420;
  allocator local_3f9;
  string local_3f8;
  allocator local_3d1;
  string local_3d0;
  allocator local_3a9;
  string local_3a8;
  allocator local_381;
  string local_380;
  allocator local_359;
  string local_358;
  allocator local_331;
  string local_330;
  allocator local_309;
  string local_308;
  allocator local_2e1;
  string local_2e0;
  allocator local_2b9;
  string local_2b8;
  allocator local_291;
  string local_290;
  allocator local_269;
  string local_268;
  allocator local_241;
  string local_240;
  allocator local_219;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  undefined1 local_d9;
  Mesh local_d8;
  ulong local_30;
  size_t i;
  Mesh *local_18;
  Mesh *_mesh_local;
  Model *this_local;
  
  local_18 = _mesh;
  _mesh_local = (Mesh *)this;
  Mesh::operator=(&this->mesh,_mesh);
  pVVar4 = (Vbo *)operator_new(0x60);
  Vbo::Vbo(pVVar4,local_18);
  this->m_model_vbo = pVVar4;
  BoundingBox::clean(&this->m_bbox);
  for (local_30 = 0; uVar1 = local_30, sVar5 = Mesh::getVerticesTotal(local_18), uVar1 < sVar5;
      local_30 = local_30 + 1) {
    _v = Mesh::getVertex(local_18,local_30);
    BoundingBox::expand(&this->m_bbox,_v);
  }
  fVar6 = glm::length<3,float,(glm::qualifier)0>(&(this->m_bbox).min);
  y = glm::length<3,float,(glm::qualifier)0>(&(this->m_bbox).max);
  fVar6 = glm::min<float>(fVar6,y);
  this->m_area = fVar6;
  pVVar4 = (Vbo *)operator_new(0x60);
  local_d9 = 1;
  cubeCornersMesh(&local_d8,&this->m_bbox,0.25);
  Vbo::Vbo(pVVar4,&local_d8);
  local_d9 = 0;
  this->m_bbox_vbo = pVVar4;
  Mesh::~Mesh(&local_d8);
  bVar2 = Mesh::haveColors(local_18);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"MODEL_VERTEX_COLOR",&local_101);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,"v_color",&local_129);
    addDefine(this,&local_100,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  bVar2 = Mesh::haveNormals(local_18);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_150,"MODEL_VERTEX_NORMAL",&local_151);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_178,"v_normal",&local_179);
    addDefine(this,&local_150,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
  }
  bVar2 = Mesh::haveTexCoords(local_18);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a0,"MODEL_VERTEX_TEXCOORD",&local_1a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c8,"v_texcoord",&local_1c9);
    addDefine(this,&local_1a0,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  }
  bVar2 = Mesh::haveTangents(local_18);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f0,"MODEL_VERTEX_TANGENT",&local_1f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_218,"v_tangent",&local_219);
    addDefine(this,&local_1f0,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  }
  DVar3 = Mesh::getDrawMode(local_18);
  if (DVar3 == POINTS) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_240,"MODEL_PRIMITIVE_POINTS",&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_268,"",&local_269);
    addDefine(this,&local_240,&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
  }
  else {
    DVar3 = Mesh::getDrawMode(local_18);
    if (DVar3 == LINES) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_290,"MODEL_PRIMITIVE_LINES",&local_291);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2b8,"",&local_2b9);
      addDefine(this,&local_290,&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
      std::__cxx11::string::~string((string *)&local_290);
      std::allocator<char>::~allocator((allocator<char> *)&local_291);
    }
    else {
      DVar3 = Mesh::getDrawMode(local_18);
      if (DVar3 == LINE_LOOP) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2e0,"MODEL_PRIMITIVE_LINE_LOOP",&local_2e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_308,"",&local_309);
        addDefine(this,&local_2e0,&local_308);
        std::__cxx11::string::~string((string *)&local_308);
        std::allocator<char>::~allocator((allocator<char> *)&local_309);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
      }
      else {
        DVar3 = Mesh::getDrawMode(local_18);
        if (DVar3 == LINE_STRIP) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_330,"MODEL_PRIMITIVE_LINE_STRIP",&local_331)
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_358,"",&local_359);
          addDefine(this,&local_330,&local_358);
          std::__cxx11::string::~string((string *)&local_358);
          std::allocator<char>::~allocator((allocator<char> *)&local_359);
          std::__cxx11::string::~string((string *)&local_330);
          std::allocator<char>::~allocator((allocator<char> *)&local_331);
        }
        else {
          DVar3 = Mesh::getDrawMode(local_18);
          if (DVar3 == TRIANGLES) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_380,"MODEL_PRIMITIVE_TRIANGLES",&local_381);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_3a8,"",&local_3a9);
            addDefine(this,&local_380,&local_3a8);
            std::__cxx11::string::~string((string *)&local_3a8);
            std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
            std::__cxx11::string::~string((string *)&local_380);
            std::allocator<char>::~allocator((allocator<char> *)&local_381);
          }
          else {
            DVar3 = Mesh::getDrawMode(local_18);
            if (DVar3 == TRIANGLE_FAN) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_3d0,"MODEL_PRIMITIVE_TRIANGLE_FAN",&local_3d1);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_3f8,"",&local_3f9);
              addDefine(this,&local_3d0,&local_3f8);
              std::__cxx11::string::~string((string *)&local_3f8);
              std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
              std::__cxx11::string::~string((string *)&local_3d0);
              std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
            }
          }
        }
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_420,"LIGHT_SHADOWMAP",&local_421);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_448,"u_lightShadowMap",&local_449);
  addDefine(this,&local_420,&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_470,"LIGHT_SHADOWMAP_SIZE",&local_471);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_498,"2048.0",&local_499);
  addDefine(this,&local_470,&local_498);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  return true;
}

Assistant:

bool Model::setGeom(const Mesh& _mesh) {
    mesh = _mesh;

    // Load Geometry VBO
    m_model_vbo = new Vbo(_mesh);

    m_bbox.clean();
    for (size_t i = 0; i < _mesh.getVerticesTotal(); i++)
        m_bbox.expand( _mesh.getVertex(i) );

    m_area = glm::min(glm::length(m_bbox.min), glm::length(m_bbox.max));
    m_bbox_vbo = new Vbo( cubeCornersMesh( m_bbox, 0.25 ) );

    // Setup Shader and GEOMETRY DEFINE FLAGS
    if (_mesh.haveColors())
        addDefine("MODEL_VERTEX_COLOR", "v_color");

    if (_mesh.haveNormals())
        addDefine("MODEL_VERTEX_NORMAL", "v_normal");

    if (_mesh.haveTexCoords())
        addDefine("MODEL_VERTEX_TEXCOORD", "v_texcoord");

    if (_mesh.haveTangents())
        addDefine("MODEL_VERTEX_TANGENT", "v_tangent");

    if (_mesh.getDrawMode() == POINTS)
        addDefine("MODEL_PRIMITIVE_POINTS");
    else if (_mesh.getDrawMode() == LINES)
        addDefine("MODEL_PRIMITIVE_LINES");
    else if (_mesh.getDrawMode() == LINE_LOOP)
        addDefine("MODEL_PRIMITIVE_LINE_LOOP");
    else if (_mesh.getDrawMode() == LINE_STRIP)
        addDefine("MODEL_PRIMITIVE_LINE_STRIP");
    else if (_mesh.getDrawMode() == TRIANGLES)
        addDefine("MODEL_PRIMITIVE_TRIANGLES");
    else if (_mesh.getDrawMode() == TRIANGLE_FAN)
        addDefine("MODEL_PRIMITIVE_TRIANGLE_FAN");

    addDefine("LIGHT_SHADOWMAP", "u_lightShadowMap");
    addDefine("LIGHT_SHADOWMAP_SIZE", "2048.0");

    return true;
}